

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention_x86::forward
          (MultiHeadAttention_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  long *plVar9;
  int iVar10;
  Allocator *pAVar11;
  int iVar12;
  void *pvVar13;
  Allocator *pAVar14;
  undefined4 uVar15;
  long *plVar16;
  undefined4 uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int _w;
  long lVar21;
  long lVar22;
  void *pvVar23;
  pointer pMVar24;
  pointer pMVar25;
  void *pvVar26;
  Option opt1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  long local_310;
  long local_300;
  value_type local_2e8;
  long local_2a0;
  Mat local_298;
  Option *local_250;
  long local_248;
  MultiHeadAttention_x86 *local_240;
  Mat local_238;
  Mat local_1e8;
  Mat local_198;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_148;
  pointer local_140;
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined8 local_f8;
  void *local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  long *local_c8;
  undefined4 uStack_c0;
  int iStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined8 local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_88;
  int iStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_48;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar19 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4;
  lVar20 = (lVar19 >> 3) * -0x71c71c71c71c71c7;
  pMVar24 = pMVar4;
  pMVar25 = pMVar4;
  if (lVar20 != 1) {
    if (lVar20 == 2) {
      if (*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0) {
        pMVar24 = pMVar4 + 1;
        pMVar25 = pMVar4 + 1;
      }
    }
    else {
      pMVar25 = pMVar4 + 1;
      if ((lVar19 != 0xd8) ||
         (pMVar24 = pMVar25,
         *(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0)) {
        pMVar24 = pMVar4 + 2;
      }
    }
  }
  if (*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) == 0) {
    local_238.cstep = 0;
    local_238.data = (void *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.allocator = (Allocator *)0x0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
  }
  else {
    local_238.data = *(void **)((long)pMVar4 + lVar19 + -0x48);
    piVar5 = *(int **)((long)pMVar4 + lVar19 + -0x40);
    local_238.refcount._0_4_ = SUB84(piVar5,0);
    local_238.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
    uVar6 = *(undefined8 *)((long)pMVar4 + lVar19 + -0x38);
    local_238.elemsize._0_4_ = (undefined4)uVar6;
    local_238.elemsize._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    local_238.elempack = *(int *)((long)pMVar4 + lVar19 + -0x30);
    local_238.allocator = *(Allocator **)((long)pMVar4 + lVar19 + -0x28);
    puVar1 = (undefined8 *)((long)pMVar4 + lVar19 + -0x20);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    local_238.dims = (int)uVar6;
    local_238.w = (int)((ulong)uVar6 >> 0x20);
    local_238.h = (int)uVar7;
    local_238.d = (int)((ulong)uVar7 >> 0x20);
    local_238.c = *(int *)((long)pMVar4 + lVar19 + -0x10);
    local_238.cstep = *(ulong *)((long)pMVar4 + lVar19 + -8);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
  }
  local_298.cstep = 0;
  local_298.data = (void *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize._0_4_ = 0;
  local_298.elemsize._4_4_ = 0;
  local_298.elempack = 0;
  local_298.allocator = (Allocator *)0x0;
  local_298.dims = 0;
  local_298.w = 0;
  local_298.h = 0;
  local_298.d = 0;
  local_298.c = 0;
  local_148 = top_blobs;
  if (local_238.elempack == 1) {
    piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_298.data = local_238.data;
    local_298.refcount._0_4_ = local_238.refcount._0_4_;
    local_298.refcount._4_4_ = local_238.refcount._4_4_;
    local_298.elemsize._0_4_ = (undefined4)local_238.elemsize;
    local_298.elemsize._4_4_ = local_238.elemsize._4_4_;
    local_298.elempack = local_238.elempack;
    local_298.allocator = local_238.allocator;
    local_298.dims = local_238.dims;
    local_298.w = local_238.w;
    local_298.h = local_238.h;
    local_298.d = local_238.d;
    local_298.c = local_238.c;
    local_298.cstep = local_238.cstep;
  }
  else {
    convert_packing(&local_238,&local_298,1,opt);
  }
  iVar18 = *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]) /
           *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]);
  _w = pMVar4->elempack * pMVar4->h;
  iVar2 = pMVar25->elempack;
  iVar3 = pMVar25->h;
  local_a8 = 0;
  local_e8 = (void *)0x0;
  uStack_e0 = 0;
  uStack_dc = 0;
  local_d8 = 0;
  uStack_d4 = 0;
  local_d0 = 0;
  local_c8 = (long *)0x0;
  uStack_c0 = 0;
  iStack_bc = 0;
  uStack_b8 = 0;
  uStack_b4 = 0;
  local_b0 = 0;
  local_140 = pMVar24;
  (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar4,&local_e8,opt);
  local_f8 = 0;
  local_138 = (void *)0x0;
  uStack_130 = 0;
  uStack_12c = 0;
  local_128 = 0;
  uStack_124 = 0;
  local_120 = 0;
  local_118 = (long *)0x0;
  uStack_110 = 0;
  iStack_10c = 0;
  uStack_108 = 0;
  uStack_104 = 0;
  local_100 = 0;
  (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar25,&local_138,opt);
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  Mat::create(&local_198,iVar2 * iVar3,
              *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) * _w,4,
              opt->blob_allocator);
  lVar19 = (long)iVar18;
  local_248 = (long)_w;
  local_250 = opt;
  local_240 = this;
  if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3])) {
    lVar20 = 0;
    local_310 = 0;
    local_300 = 0;
    do {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_1e8,2,
                 (allocator_type *)&local_2e8);
      iVar2 = iStack_bc;
      plVar9 = local_c8;
      uVar17 = local_d0;
      pvVar23 = local_1e8.data;
      lVar21 = (long)iStack_bc;
      lVar22 = CONCAT44(uStack_d4,local_d8);
      pvVar26 = (void *)(lVar20 * lVar21 * lVar22 + (long)local_e8);
      piVar5 = *(int **)((long)local_1e8.data + 8);
      local_2a0 = lVar20;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (*(long **)((long)local_1e8.data + 0x20) == (long *)0x0) {
            if (*local_1e8.data != (void *)0x0) {
              free(*local_1e8.data);
            }
          }
          else {
            (**(code **)(**(long **)((long)local_1e8.data + 0x20) + 0x18))();
          }
        }
      }
      iVar3 = iStack_10c;
      plVar16 = local_118;
      uVar15 = local_120;
      pvVar13 = local_1e8.data;
      *(void **)pvVar23 = pvVar26;
      *(long *)((long)pvVar23 + 8) = 0;
      *(long *)((long)pvVar23 + 0x10) = lVar22;
      *(undefined4 *)((long)pvVar23 + 0x18) = uVar17;
      *(long **)((long)pvVar23 + 0x20) = plVar9;
      *(undefined4 *)((long)pvVar23 + 0x28) = 2;
      *(int *)((long)pvVar23 + 0x2c) = iVar2;
      *(int *)((long)pvVar23 + 0x30) = iVar18;
      *(undefined8 *)((long)pvVar23 + 0x34) = 0x100000001;
      *(long *)((long)pvVar23 + 0x40) = lVar21 * lVar19;
      lVar22 = (long)iStack_10c;
      lVar20 = CONCAT44(uStack_124,local_128);
      piVar5 = *(int **)((long)local_1e8.data + 0x50);
      pvVar23 = (void *)(local_2a0 * lVar22 * lVar20 + (long)local_138);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (*(long **)((long)local_1e8.data + 0x68) == (long *)0x0) {
            if (*(void **)((long)local_1e8.data + 0x48) != (void *)0x0) {
              free(*(void **)((long)local_1e8.data + 0x48));
            }
          }
          else {
            (**(code **)(**(long **)((long)local_1e8.data + 0x68) + 0x18))();
          }
        }
      }
      *(void **)((long)pvVar13 + 0x48) = pvVar23;
      *(long *)((long)pvVar13 + 0x50) = 0;
      *(long *)((long)pvVar13 + 0x58) = lVar20;
      *(undefined4 *)((long)pvVar13 + 0x60) = uVar15;
      *(long **)((long)pvVar13 + 0x68) = plVar16;
      *(undefined4 *)((long)pvVar13 + 0x70) = 2;
      *(int *)((long)pvVar13 + 0x74) = iVar3;
      *(int *)((long)pvVar13 + 0x78) = iVar18;
      *(undefined8 *)((long)pvVar13 + 0x7c) = 0x100000001;
      *(long *)((long)pvVar13 + 0x88) = lVar22 * lVar19;
      if (*(int *)(&local_240->field_0xe4 + (long)local_240->_vptr_MultiHeadAttention_x86[-3]) != 0)
      {
        if (local_298.dims == 3) {
          local_2e8.cstep = CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
          local_2e8.data =
               (void *)(local_298.cstep * local_300 * local_2e8.cstep + (long)local_298.data);
          local_2e8.refcount._0_4_ = 0;
          local_2e8.refcount._4_4_ = 0;
          local_2e8.d = 1;
          local_2e8.c = local_298.d;
          local_2e8.cstep =
               ((long)local_298.h * (long)local_298.w * local_2e8.cstep + 0xf & 0xfffffffffffffff0)
               / local_2e8.cstep;
          local_2e8.dims = 2;
        }
        else {
          piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
          local_2e8.data = local_298.data;
          local_2e8.refcount._0_4_ = local_298.refcount._0_4_;
          local_2e8.refcount._4_4_ = local_298.refcount._4_4_;
          local_2e8.dims = local_298.dims;
          local_2e8.d = local_298.d;
          local_2e8.c = local_298.c;
          local_2e8.cstep = local_298.cstep;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
        }
        local_2e8.h = local_298.h;
        local_2e8.w = local_298.w;
        local_2e8.allocator = local_298.allocator;
        local_2e8.elempack = local_298.elempack;
        local_2e8.elemsize._4_4_ = local_298.elemsize._4_4_;
        local_2e8.elemsize._0_4_ = (undefined4)local_298.elemsize;
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_1e8,&local_2e8);
        piVar5 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_2e8.allocator == (Allocator *)0x0) {
              if (local_2e8.data != (void *)0x0) {
                free(local_2e8.data);
              }
            }
            else {
              (*(local_2e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&local_88,1,(allocator_type *)&local_2e8);
      iVar3 = local_198.w;
      pAVar14 = local_198.allocator;
      iVar2 = local_198.elempack;
      lVar22 = (long)local_198.w;
      lVar20 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      pvVar23 = (void *)(local_310 * lVar22 * lVar20 + (long)local_198.data);
      plVar9 = (long *)CONCAT44(local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
      piVar5 = (int *)plVar9[1];
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if ((long *)plVar9[4] == (long *)0x0) {
            if ((void *)*plVar9 != (void *)0x0) {
              free((void *)*plVar9);
            }
          }
          else {
            (**(code **)(*(long *)plVar9[4] + 0x18))();
          }
        }
      }
      this = local_240;
      lVar21 = local_248;
      opt = local_250;
      *plVar9 = (long)pvVar23;
      plVar9[1] = 0;
      plVar9[2] = lVar20;
      *(int *)(plVar9 + 3) = iVar2;
      plVar9[4] = (long)pAVar14;
      *(undefined4 *)(plVar9 + 5) = 2;
      *(int *)((long)plVar9 + 0x2c) = iVar3;
      *(int *)(plVar9 + 6) = _w;
      *(undefined8 *)((long)plVar9 + 0x34) = 0x100000001;
      plVar9[8] = lVar22 * local_248;
      local_2e8.refcount._0_4_ = *(undefined4 *)&local_250->blob_allocator;
      local_2e8.refcount._4_4_ = *(undefined4 *)((long)&local_250->blob_allocator + 4);
      local_2e8.elemsize._0_4_ = *(undefined4 *)&local_250->workspace_allocator;
      local_2e8.elemsize._4_4_ = *(undefined4 *)((long)&local_250->workspace_allocator + 4);
      local_2e8.elempack = local_250->openmp_blocktime;
      local_2e8._28_1_ = local_250->use_winograd_convolution;
      local_2e8._29_1_ = local_250->use_sgemm_convolution;
      local_2e8._30_1_ = local_250->use_int8_inference;
      local_2e8._31_1_ = local_250->use_vulkan_compute;
      local_2e8.allocator = *(Allocator **)&local_250->use_bf16_storage;
      local_2e8.dims._0_1_ = local_250->use_shader_pack8;
      local_2e8.dims._1_1_ = local_250->use_subgroup_basic;
      local_2e8.dims._2_1_ = local_250->use_subgroup_vote;
      local_2e8.dims._3_1_ = local_250->use_subgroup_ballot;
      local_2e8.w._0_1_ = local_250->use_subgroup_shuffle;
      local_2e8.w._1_1_ = local_250->use_image_storage;
      local_2e8.w._2_1_ = local_250->use_tensor_storage;
      local_2e8.w._3_1_ = local_250->use_reserved_0;
      local_2e8.h = local_250->flush_denormals;
      local_2e8.d._0_1_ = local_250->use_local_pool_allocator;
      local_2e8.d._1_1_ = local_250->use_shader_local_memory;
      local_2e8.d._2_1_ = local_250->use_cooperative_matrix;
      local_2e8.d._3_1_ = local_250->use_winograd23_convolution;
      local_2e8.c._0_1_ = local_250->use_winograd43_convolution;
      local_2e8.c._1_1_ = local_250->use_winograd63_convolution;
      local_2e8.c._2_1_ = local_250->use_a53_a55_optimized_kernel;
      local_2e8.c._3_1_ = local_250->use_reserved_7;
      local_2e8._60_1_ = local_250->use_reserved_8;
      local_2e8._61_1_ = local_250->use_reserved_9;
      local_2e8._62_1_ = local_250->use_reserved_10;
      local_2e8._63_1_ = local_250->use_reserved_11;
      local_2e8.data = (void *)CONCAT44(1,*(undefined4 *)local_250);
      (*local_240->qk_gemm->_vptr_Layer[6])(local_240->qk_gemm,&local_1e8,&local_88,&local_2e8);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_88);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_1e8);
      local_300 = local_300 + 1;
      local_310 = local_310 + lVar21;
      lVar20 = local_2a0 + lVar19;
    } while (local_300 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]))
    ;
  }
  piVar5 = (int *)CONCAT44(uStack_dc,uStack_e0);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_c8 == (long *)0x0) {
        if (local_e8 != (void *)0x0) {
          free(local_e8);
        }
      }
      else {
        (**(code **)(*local_c8 + 0x18))();
      }
    }
  }
  local_a8 = 0;
  local_e8 = (void *)0x0;
  uStack_e0 = 0;
  uStack_dc = 0;
  local_d8 = 0;
  uStack_d4 = 0;
  local_d0 = 0;
  uStack_c0 = 0;
  iStack_bc = 0;
  uStack_b8 = 0;
  uStack_b4 = 0;
  local_b0 = 0;
  piVar5 = (int *)CONCAT44(uStack_12c,uStack_130);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_118 == (long *)0x0) {
        if (local_138 != (void *)0x0) {
          free(local_138);
        }
      }
      else {
        (**(code **)(*local_118 + 0x18))();
      }
    }
  }
  local_f8 = 0;
  local_138 = (void *)0x0;
  uStack_130 = 0;
  uStack_12c = 0;
  local_128 = 0;
  uStack_124 = 0;
  local_120 = 0;
  uStack_110 = 0;
  iStack_10c = 0;
  uStack_108 = 0;
  uStack_104 = 0;
  local_100 = 0;
  (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_198,opt);
  local_2e8.cstep = 0;
  local_2e8.data = (void *)0x0;
  local_2e8.refcount._0_4_ = 0;
  local_2e8.refcount._4_4_ = 0;
  local_2e8.elemsize._0_4_ = 0;
  local_2e8.elemsize._4_4_ = 0;
  local_2e8.elempack = 0;
  local_2e8.allocator = (Allocator *)0x0;
  local_2e8.dims = 0;
  local_2e8.w = 0;
  local_2e8.h = 0;
  local_2e8.d = 0;
  local_2e8.c = 0;
  (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_140,&local_2e8,opt);
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8.elemsize._4_4_ = 0;
  local_1e8.elempack = 0;
  local_1e8.allocator = (Allocator *)0x0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
  Mat::create(&local_1e8,_w,
              *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]) * iVar18,4,
              opt->blob_allocator);
  if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3])) {
    lVar21 = 0;
    lVar22 = 0;
    lVar20 = 0;
    do {
      local_2a0 = lVar20;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&local_a0,2,(allocator_type *)&local_88);
      pMVar25 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar3 = local_198.w;
      pAVar14 = local_198.allocator;
      iVar2 = local_198.elempack;
      lVar20 = (long)local_198.w;
      sVar8 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      pvVar23 = (void *)(lVar21 * lVar20 * sVar8 + (long)local_198.data);
      piVar5 = (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if ((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (*(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar4 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = local_2e8.w;
      pAVar11 = local_2e8.allocator;
      iVar10 = local_2e8.elempack;
      pMVar25->data = pvVar23;
      pMVar25->refcount = (int *)0x0;
      pMVar25->elemsize = sVar8;
      pMVar25->elempack = iVar2;
      pMVar25->allocator = pAVar14;
      pMVar25->dims = 2;
      pMVar25->w = iVar3;
      pMVar25->h = _w;
      pMVar25->d = 1;
      pMVar25->c = 1;
      pMVar25->cstep = lVar20 * local_248;
      lVar20 = (long)local_2e8.w;
      sVar8 = CONCAT44(local_2e8.elemsize._4_4_,(undefined4)local_2e8.elemsize);
      piVar5 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].refcount;
      pvVar23 = (void *)(lVar22 * lVar20 * sVar8 + (long)local_2e8.data);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
            if (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].data != (void *)0x0) {
              free(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
          }
          else {
            (*(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar4[1].data = pvVar23;
      pMVar4[1].refcount = (int *)0x0;
      pMVar4[1].elemsize = sVar8;
      pMVar4[1].elempack = iVar10;
      pMVar4[1].allocator = pAVar11;
      pMVar4[1].dims = 2;
      pMVar4[1].w = iVar12;
      pMVar4[1].h = iVar18;
      pMVar4[1].d = 1;
      pMVar4[1].c = 1;
      pMVar4[1].cstep = lVar20 * lVar19;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&local_48,1,(allocator_type *)&local_88);
      pMVar25 = local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar3 = local_1e8.w;
      pAVar14 = local_1e8.allocator;
      iVar2 = local_1e8.elempack;
      lVar20 = (long)local_1e8.w;
      sVar8 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
      pvVar23 = (void *)((long)local_1e8.data + lVar22 * lVar20 * sVar8);
      piVar5 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (*(local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      this = local_240;
      pMVar25->data = pvVar23;
      pMVar25->refcount = (int *)0x0;
      pMVar25->elemsize = sVar8;
      pMVar25->elempack = iVar2;
      pMVar25->allocator = pAVar14;
      pMVar25->dims = 2;
      pMVar25->w = iVar3;
      pMVar25->h = iVar18;
      pMVar25->d = 1;
      pMVar25->c = 1;
      pMVar25->cstep = lVar20 * lVar19;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)local_250;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)&local_250->blob_allocator;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           *(undefined4 *)((long)&local_250->blob_allocator + 4);
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           *(undefined4 *)&local_250->workspace_allocator;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           *(undefined4 *)((long)&local_250->workspace_allocator + 4);
      iStack_70 = local_250->openmp_blocktime;
      uStack_6c._0_1_ = local_250->use_winograd_convolution;
      uStack_6c._1_1_ = local_250->use_sgemm_convolution;
      uStack_6c._2_1_ = local_250->use_int8_inference;
      uStack_6c._3_1_ = local_250->use_vulkan_compute;
      local_68._0_1_ = local_250->use_bf16_storage;
      local_68._1_1_ = local_250->use_fp16_packed;
      local_68._2_1_ = local_250->use_fp16_storage;
      local_68._3_1_ = local_250->use_fp16_arithmetic;
      uStack_64._0_1_ = local_250->use_int8_packed;
      uStack_64._1_1_ = local_250->use_int8_storage;
      uStack_64._2_1_ = local_250->use_int8_arithmetic;
      uStack_64._3_1_ = local_250->use_packing_layout;
      uStack_60._0_1_ = local_250->use_shader_pack8;
      uStack_60._1_1_ = local_250->use_subgroup_basic;
      uStack_60._2_1_ = local_250->use_subgroup_vote;
      uStack_60._3_1_ = local_250->use_subgroup_ballot;
      uStack_5c._0_1_ = local_250->use_subgroup_shuffle;
      uStack_5c._1_1_ = local_250->use_image_storage;
      uStack_5c._2_1_ = local_250->use_tensor_storage;
      uStack_5c._3_1_ = local_250->use_reserved_0;
      local_58 = local_250->flush_denormals;
      uStack_54._0_1_ = local_250->use_local_pool_allocator;
      uStack_54._1_1_ = local_250->use_shader_local_memory;
      uStack_54._2_1_ = local_250->use_cooperative_matrix;
      uStack_54._3_1_ = local_250->use_winograd23_convolution;
      uStack_50._0_1_ = local_250->use_winograd43_convolution;
      uStack_50._1_1_ = local_250->use_winograd63_convolution;
      uStack_50._2_1_ = local_250->use_a53_a55_optimized_kernel;
      uStack_50._3_1_ = local_250->use_reserved_7;
      uStack_4c._0_1_ = local_250->use_reserved_8;
      uStack_4c._1_1_ = local_250->use_reserved_9;
      uStack_4c._2_1_ = local_250->use_reserved_10;
      uStack_4c._3_1_ = local_250->use_reserved_11;
      local_88.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 1;
      (*local_240->qkv_gemm->_vptr_Layer[6])(local_240->qkv_gemm,&local_a0,&local_48,&local_88);
      lVar20 = local_2a0;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_48);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_a0);
      lVar20 = lVar20 + 1;
      lVar22 = lVar22 + lVar19;
      lVar21 = lVar21 + local_248;
    } while (lVar20 < *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  }
  piVar5 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_2e8.allocator == (Allocator *)0x0) {
        if (local_2e8.data != (void *)0x0) {
          free(local_2e8.data);
        }
      }
      else {
        (*(local_2e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_2e8.cstep = 0;
  local_2e8.data = (void *)0x0;
  local_2e8.refcount._0_4_ = 0;
  local_2e8.refcount._4_4_ = 0;
  local_2e8.elemsize._0_4_ = 0;
  local_2e8.elemsize._4_4_ = 0;
  local_2e8.elempack = 0;
  local_2e8.dims = 0;
  local_2e8.w = 0;
  local_2e8.h = 0;
  local_2e8.d = 0;
  local_2e8.c = 0;
  (*this->o_gemm->_vptr_Layer[7])
            (this->o_gemm,&local_1e8,
             (local_148->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start,local_250);
  piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        if (local_1e8.data != (void *)0x0) {
          free(local_1e8.data);
        }
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_2e8.allocator == (Allocator *)0x0) {
        if (local_2e8.data != (void *)0x0) {
          free(local_2e8.data);
        }
      }
      else {
        (*(local_2e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(uStack_12c,uStack_130);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_118 == (long *)0x0) {
        if (local_138 != (void *)0x0) {
          free(local_138);
        }
      }
      else {
        (**(code **)(*local_118 + 0x18))();
      }
    }
  }
  piVar5 = (int *)CONCAT44(uStack_dc,uStack_e0);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_c8 == (long *)0x0) {
        if (local_e8 != (void *)0x0) {
          free(local_e8);
        }
      }
      else {
        (**(code **)(*local_c8 + 0x18))();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        if (local_298.data != (void *)0x0) {
          free(local_298.data);
        }
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int MultiHeadAttention_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Mat attn_mask_blob_unpacked;
    if (attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    q_gemm->forward(q_blob, q_affine, opt);

    Mat k_affine;
    k_gemm->forward(k_blob, k_affine, opt);

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }

    q_affine.release();
    k_affine.release();

    qk_softmax->forward_inplace(qk_cross, opt);

    Mat v_affine;
    v_gemm->forward(v_blob, v_affine, opt);

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }

    v_affine.release();

    o_gemm->forward(qkv_cross, top_blobs[0], opt);

    return 0;
}